

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O2

DPIExportSyntax * __thiscall
slang::parsing::Parser::parseDPIExport(Parser *this,AttrList attributes)

{
  bool bVar1;
  DPIExportSyntax *pDVar2;
  Token keyword;
  Token specString;
  Token name;
  Token local_b8;
  Token local_a8;
  Token local_98;
  Token local_88;
  Token local_78;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_68;
  
  keyword = ParserBase::consume(&this->super_ParserBase);
  specString = parseDPISpecString(this);
  Token::Token(&local_98);
  Token::Token(&local_a8);
  bVar1 = ParserBase::peek(&this->super_ParserBase,Identifier);
  if (bVar1) {
    local_98 = ParserBase::consume(&this->super_ParserBase);
    local_a8 = ParserBase::expect(&this->super_ParserBase,Equals);
  }
  Token::Token(&local_b8);
  bVar1 = ParserBase::peek(&this->super_ParserBase,TaskKeyword);
  if (bVar1) {
    local_b8 = ParserBase::consume(&this->super_ParserBase);
  }
  else {
    local_b8 = ParserBase::expect(&this->super_ParserBase,FunctionKeyword);
  }
  name = ParserBase::expect(&this->super_ParserBase,Identifier);
  local_88 = ParserBase::expect(&this->super_ParserBase,Semicolon);
  local_68.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
  local_68.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_68.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_68.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005a2b60;
  local_78 = name;
  local_68.super_SyntaxListBase.childCount = attributes._M_extent._M_extent_value._M_extent_value;
  local_68.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       attributes._M_ptr;
  local_68.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = attributes._M_extent._M_extent_value._M_extent_value;
  pDVar2 = slang::syntax::SyntaxFactory::dPIExport
                     (&this->factory,&local_68,keyword,specString,local_98,local_a8,local_b8,name,
                      local_88);
  return pDVar2;
}

Assistant:

DPIExportSyntax& Parser::parseDPIExport(AttrList attributes) {
    Token keyword = consume();
    Token specString = parseDPISpecString();

    Token c_identifier, equals;
    if (peek(TokenKind::Identifier)) {
        c_identifier = consume();
        equals = expect(TokenKind::Equals);
    }

    Token functionOrTask;
    if (peek(TokenKind::TaskKeyword))
        functionOrTask = consume();
    else
        functionOrTask = expect(TokenKind::FunctionKeyword);

    Token name = expect(TokenKind::Identifier);
    Token semi = expect(TokenKind::Semicolon);
    return factory.dPIExport(attributes, keyword, specString, c_identifier, equals, functionOrTask,
                             name, semi);
}